

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall google::protobuf::io::CordOutputStream::BackUp(CordOutputStream *this,int count)

{
  bool bVar1;
  int64_t iVar2;
  size_t sVar3;
  CordBuffer local_28;
  int local_18;
  int local_14;
  int buffer_length;
  int count_local;
  CordOutputStream *this_local;
  
  bVar1 = false;
  local_14 = count;
  _buffer_length = this;
  if (-1 < count) {
    iVar2 = ByteCount(this);
    bVar1 = count <= iVar2;
  }
  if (bVar1) {
    if (local_14 != 0) {
      sVar3 = absl::lts_20250127::CordBuffer::length(&this->buffer_);
      local_18 = (int)sVar3;
      if (local_18 < local_14) {
        __assert_fail("count <= buffer_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                      ,0x297,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
      }
      if (local_18 < local_14) {
        memset(&local_28,0,0x10);
        absl::lts_20250127::CordBuffer::CordBuffer(&local_28);
        absl::lts_20250127::CordBuffer::operator=(&this->buffer_,&local_28);
        absl::lts_20250127::CordBuffer::~CordBuffer(&local_28);
        absl::lts_20250127::Cord::RemoveSuffix(&this->cord_,(long)local_14);
        this->state_ = kSteal;
      }
      else {
        absl::lts_20250127::CordBuffer::SetLength(&this->buffer_,(long)(local_18 - local_14));
        this->state_ = kPartial;
      }
    }
    return;
  }
  __assert_fail("0 <= count && count <= ByteCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                ,0x292,"virtual void google::protobuf::io::CordOutputStream::BackUp(int)");
}

Assistant:

void CordOutputStream::BackUp(int count) {
  // Check if something to do, else state remains unchanged.
  assert(0 <= count && count <= ByteCount());
  if (count == 0) return;

  // Backup() is not supposed to backup beyond last Next() call
  const int buffer_length = static_cast<int>(buffer_.length());
  assert(count <= buffer_length);
  if (count <= buffer_length) {
    buffer_.SetLength(static_cast<size_t>(buffer_length - count));
    state_ = State::kPartial;
  } else {
    buffer_ = {};
    cord_.RemoveSuffix(static_cast<size_t>(count));
    state_ = State::kSteal;
  }
}